

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
* deqp::gles2::Performance::singleValueShaderAttributes
            (vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
             *__return_storage_ptr__,string *nameSpecialization)

{
  Vector<float,_4> local_230;
  Vector<float,_4> local_220;
  Vector<float,_4> local_210;
  Vector<float,_4> local_200;
  Vector<float,_16> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  AttribSpec local_190;
  Vector<float,_4> local_12c;
  Vector<float,_4> local_11c;
  Vector<float,_4> local_10c;
  Vector<float,_4> local_fc;
  Vector<float,_16> local_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  AttribSpec local_80;
  undefined1 local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *nameSpecialization_local;
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  *result;
  
  local_19 = 0;
  local_18 = nameSpecialization;
  nameSpecialization_local = (string *)__return_storage_ptr__;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::vector(__return_storage_ptr__);
  std::operator+(&local_a0,"a_position",local_18);
  tcu::Vector<float,_4>::Vector(&local_fc,-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_10c,-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_11c,1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_12c,1.0,1.0,0.0,1.0);
  combineVec4ToVec16(&local_ec,&local_fc,&local_10c,&local_11c,&local_12c);
  ShaderCompilerCase::AttribSpec::AttribSpec(&local_80,&local_a0,&local_ec);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::push_back(__return_storage_ptr__,&local_80);
  ShaderCompilerCase::AttribSpec::~AttribSpec(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::operator+(&local_1b0,"a_value",local_18);
  tcu::Vector<float,_4>::Vector(&local_200,1.0,1.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_210,1.0,1.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_220,1.0,1.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_230,1.0,1.0,1.0,1.0);
  combineVec4ToVec16(&local_1f0,&local_200,&local_210,&local_220,&local_230);
  ShaderCompilerCase::AttribSpec::AttribSpec(&local_190,&local_1b0,&local_1f0);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::push_back(__return_storage_ptr__,&local_190);
  ShaderCompilerCase::AttribSpec::~AttribSpec(&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  return __return_storage_ptr__;
}

Assistant:

static vector<ShaderCompilerCase::AttribSpec> singleValueShaderAttributes (const string& nameSpecialization)
{
	vector<ShaderCompilerCase::AttribSpec> result;

	result.push_back(ShaderCompilerCase::AttribSpec("a_position" + nameSpecialization,
													combineVec4ToVec16(Vec4(-1.0f, -1.0f,  0.0f,  1.0f),
																	   Vec4(-1.0f,  1.0f,  0.0f,  1.0f),
																	   Vec4( 1.0f, -1.0f,  0.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  0.0f,  1.0f))));

	result.push_back(ShaderCompilerCase::AttribSpec("a_value" + nameSpecialization,
													combineVec4ToVec16(Vec4( 1.0f,  1.0f,  1.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  1.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  1.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  1.0f,  1.0f))));

	return result;
}